

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void sysbvm_environment_waitPendingAnalysis(sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  if ((environment & 0xf) == 0 && environment != 0) {
    do {
      if (*(sysbvm_tuple_t *)(environment + 0x38) != 0) {
        sysbvm_analysisQueue_waitPendingAnalysis(context,*(sysbvm_tuple_t *)(environment + 0x38));
        return;
      }
      environment = *(ulong *)(environment + 0x30);
    } while ((environment != 0) && ((environment & 0xf) == 0));
  }
  sysbvm_error("A delayed analysis queue is not available in this context.");
}

Assistant:

SYSBVM_API void sysbvm_environment_waitPendingAnalysis(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    sysbvm_tuple_t analysisQueue = sysbvm_environment_lookupAnalysisQueue(context, environment);
    if(!analysisQueue)
        sysbvm_error("A delayed analysis queue is not available in this context.");

    sysbvm_analysisQueue_waitPendingAnalysis(context, analysisQueue);
}